

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_converters.c
# Opt level: O2

PaUtilConverter *
PaUtil_SelectConverter
          (PaSampleFormat sourceFormat,PaSampleFormat destinationFormat,PaStreamFlags flags)

{
  PaUtilConverter *pPVar1;
  ulong uVar2;
  
  uVar2 = sourceFormat & 0xffffffff7fffffff;
  pPVar1 = (PaUtilConverter *)0x0;
  switch(uVar2) {
  case 1:
    uVar2 = destinationFormat & 0xffffffff7fffffff;
    pPVar1 = (PaUtilConverter *)0x0;
    switch(uVar2) {
    case 1:
switchD_0010710a_caseD_2:
      return paConverters.Copy_32_To_32;
    case 2:
      if ((flags & 1) != 0) {
        if ((flags & 2) == 0) {
          return paConverters.Float32_To_Int32_Dither;
        }
        return paConverters.Float32_To_Int32;
      }
      if ((flags & 2) == 0) {
        return paConverters.Float32_To_Int32_DitherClip;
      }
      return paConverters.Float32_To_Int32_Clip;
    case 3:
    case 5:
    case 6:
    case 7:
      break;
    case 4:
      if ((flags & 1) != 0) {
        if ((flags & 2) == 0) {
          return paConverters.Float32_To_Int24_Dither;
        }
        return paConverters.Float32_To_Int24;
      }
      if ((flags & 2) == 0) {
        return paConverters.Float32_To_Int24_DitherClip;
      }
      return paConverters.Float32_To_Int24_Clip;
    case 8:
      if ((flags & 1) != 0) {
        if ((flags & 2) == 0) {
          return paConverters.Float32_To_Int16_Dither;
        }
        return paConverters.Float32_To_Int16;
      }
      if ((flags & 2) == 0) {
        return paConverters.Float32_To_Int16_DitherClip;
      }
      return paConverters.Float32_To_Int16_Clip;
    default:
      if (uVar2 == 0x10) {
        if ((flags & 1) != 0) {
          if ((flags & 2) == 0) {
            return paConverters.Float32_To_Int8_Dither;
          }
          return paConverters.Float32_To_Int8;
        }
        if ((flags & 2) == 0) {
          return paConverters.Float32_To_Int8_DitherClip;
        }
        return paConverters.Float32_To_Int8_Clip;
      }
      if (uVar2 == 0x20) {
        if ((flags & 1) != 0) {
          if ((flags & 2) == 0) {
            return paConverters.Float32_To_UInt8_Dither;
          }
          return paConverters.Float32_To_UInt8;
        }
        if ((flags & 2) == 0) {
          return paConverters.Float32_To_UInt8_DitherClip;
        }
        return paConverters.Float32_To_UInt8_Clip;
      }
    }
    break;
  case 2:
    uVar2 = destinationFormat & 0xffffffff7fffffff;
    pPVar1 = (PaUtilConverter *)0x0;
    switch(uVar2) {
    case 1:
      return paConverters.Int32_To_Float32;
    case 2:
      goto switchD_0010710a_caseD_2;
    case 3:
    case 5:
    case 6:
    case 7:
      break;
    case 4:
      if ((flags & 2) == 0) {
        return paConverters.Int32_To_Int24_Dither;
      }
      return paConverters.Int32_To_Int24;
    case 8:
      if ((flags & 2) == 0) {
        return paConverters.Int32_To_Int16_Dither;
      }
      return paConverters.Int32_To_Int16;
    default:
      if (uVar2 == 0x10) {
        if ((flags & 2) == 0) {
          return paConverters.Int32_To_Int8_Dither;
        }
        return paConverters.Int32_To_Int8;
      }
      if (uVar2 == 0x20) {
        if ((flags & 2) == 0) {
          return paConverters.Int32_To_UInt8_Dither;
        }
        return paConverters.Int32_To_UInt8;
      }
    }
    break;
  case 3:
  case 5:
  case 6:
  case 7:
    break;
  case 4:
    uVar2 = destinationFormat & 0xffffffff7fffffff;
    pPVar1 = (PaUtilConverter *)0x0;
    switch(uVar2) {
    case 1:
      return paConverters.Int24_To_Float32;
    case 2:
      return paConverters.Int24_To_Int32;
    case 3:
    case 5:
    case 6:
    case 7:
      break;
    case 4:
      return paConverters.Copy_24_To_24;
    case 8:
      if ((flags & 2) == 0) {
        return paConverters.Int24_To_Int16_Dither;
      }
      return paConverters.Int24_To_Int16;
    default:
      if (uVar2 == 0x10) {
        if ((flags & 2) == 0) {
          return paConverters.Int24_To_Int8_Dither;
        }
        return paConverters.Int24_To_Int8;
      }
      if (uVar2 == 0x20) {
        if ((flags & 2) == 0) {
          return paConverters.Int24_To_UInt8_Dither;
        }
        return paConverters.Int24_To_UInt8;
      }
    }
    break;
  case 8:
    uVar2 = destinationFormat & 0xffffffff7fffffff;
    pPVar1 = (PaUtilConverter *)0x0;
    switch(uVar2) {
    case 1:
      return paConverters.Int16_To_Float32;
    case 2:
      return paConverters.Int16_To_Int32;
    case 3:
    case 5:
    case 6:
    case 7:
      break;
    case 4:
      return paConverters.Int16_To_Int24;
    case 8:
      return paConverters.Copy_16_To_16;
    default:
      if (uVar2 == 0x10) {
        if ((flags & 2) == 0) {
          return paConverters.Int16_To_Int8_Dither;
        }
        return paConverters.Int16_To_Int8;
      }
      if (uVar2 == 0x20) {
        if ((flags & 2) == 0) {
          return paConverters.Int16_To_UInt8_Dither;
        }
        return paConverters.Int16_To_UInt8;
      }
    }
    break;
  default:
    if (uVar2 == 0x10) {
      uVar2 = destinationFormat & 0xffffffff7fffffff;
      pPVar1 = (PaUtilConverter *)0x0;
      switch(uVar2) {
      case 1:
        return paConverters.Int8_To_Float32;
      case 2:
        return paConverters.Int8_To_Int32;
      case 3:
      case 5:
      case 6:
      case 7:
        break;
      case 4:
        return paConverters.Int8_To_Int24;
      case 8:
        return paConverters.Int8_To_Int16;
      default:
        if (uVar2 == 0x10) {
          return paConverters.Copy_8_To_8;
        }
        if (uVar2 == 0x20) {
          return paConverters.Int8_To_UInt8;
        }
      }
    }
    else if (uVar2 == 0x20) {
      uVar2 = destinationFormat & 0xffffffff7fffffff;
      pPVar1 = (PaUtilConverter *)0x0;
      switch(uVar2) {
      case 1:
        return paConverters.UInt8_To_Float32;
      case 2:
        return paConverters.UInt8_To_Int32;
      case 3:
      case 5:
      case 6:
      case 7:
        break;
      case 4:
        return paConverters.UInt8_To_Int24;
      case 8:
        return paConverters.UInt8_To_Int16;
      default:
        pPVar1 = paConverters.UInt8_To_Int8;
        if ((uVar2 != 0x10) && (pPVar1 = (PaUtilConverter *)0x0, uVar2 == 0x20)) {
          return paConverters.Copy_8_To_8;
        }
      }
    }
  }
  return pPVar1;
}

Assistant:

PaUtilConverter* PaUtil_SelectConverter( PaSampleFormat sourceFormat,
        PaSampleFormat destinationFormat, PaStreamFlags flags )
{
    PA_SELECT_FORMAT_( sourceFormat,
                       /* paFloat32: */
                       PA_SELECT_FORMAT_( destinationFormat,
                                          /* paFloat32: */        PA_UNITY_CONVERSION_( 32 ),
                                          /* paInt32: */          PA_SELECT_CONVERTER_DITHER_CLIP_( flags, Float32, Int32 ),
                                          /* paInt24: */          PA_SELECT_CONVERTER_DITHER_CLIP_( flags, Float32, Int24 ),
                                          /* paInt16: */          PA_SELECT_CONVERTER_DITHER_CLIP_( flags, Float32, Int16 ),
                                          /* paInt8: */           PA_SELECT_CONVERTER_DITHER_CLIP_( flags, Float32, Int8 ),
                                          /* paUInt8: */          PA_SELECT_CONVERTER_DITHER_CLIP_( flags, Float32, UInt8 )
                                        ),
                       /* paInt32: */
                       PA_SELECT_FORMAT_( destinationFormat,
                                          /* paFloat32: */        PA_USE_CONVERTER_( Int32, Float32 ),
                                          /* paInt32: */          PA_UNITY_CONVERSION_( 32 ),
                                          /* paInt24: */          PA_SELECT_CONVERTER_DITHER_( flags, Int32, Int24 ),
                                          /* paInt16: */          PA_SELECT_CONVERTER_DITHER_( flags, Int32, Int16 ),
                                          /* paInt8: */           PA_SELECT_CONVERTER_DITHER_( flags, Int32, Int8 ),
                                          /* paUInt8: */          PA_SELECT_CONVERTER_DITHER_( flags, Int32, UInt8 )
                                        ),
                       /* paInt24: */
                       PA_SELECT_FORMAT_( destinationFormat,
                                          /* paFloat32: */        PA_USE_CONVERTER_( Int24, Float32 ),
                                          /* paInt32: */          PA_USE_CONVERTER_( Int24, Int32 ),
                                          /* paInt24: */          PA_UNITY_CONVERSION_( 24 ),
                                          /* paInt16: */          PA_SELECT_CONVERTER_DITHER_( flags, Int24, Int16 ),
                                          /* paInt8: */           PA_SELECT_CONVERTER_DITHER_( flags, Int24, Int8 ),
                                          /* paUInt8: */          PA_SELECT_CONVERTER_DITHER_( flags, Int24, UInt8 )
                                        ),
                       /* paInt16: */
                       PA_SELECT_FORMAT_( destinationFormat,
                                          /* paFloat32: */        PA_USE_CONVERTER_( Int16, Float32 ),
                                          /* paInt32: */          PA_USE_CONVERTER_( Int16, Int32 ),
                                          /* paInt24: */          PA_USE_CONVERTER_( Int16, Int24 ),
                                          /* paInt16: */          PA_UNITY_CONVERSION_( 16 ),
                                          /* paInt8: */           PA_SELECT_CONVERTER_DITHER_( flags, Int16, Int8 ),
                                          /* paUInt8: */          PA_SELECT_CONVERTER_DITHER_( flags, Int16, UInt8 )
                                        ),
                       /* paInt8: */
                       PA_SELECT_FORMAT_( destinationFormat,
                                          /* paFloat32: */        PA_USE_CONVERTER_( Int8, Float32 ),
                                          /* paInt32: */          PA_USE_CONVERTER_( Int8, Int32 ),
                                          /* paInt24: */          PA_USE_CONVERTER_( Int8, Int24 ),
                                          /* paInt16: */          PA_USE_CONVERTER_( Int8, Int16 ),
                                          /* paInt8: */           PA_UNITY_CONVERSION_( 8 ),
                                          /* paUInt8: */          PA_USE_CONVERTER_( Int8, UInt8 )
                                        ),
                       /* paUInt8: */
                       PA_SELECT_FORMAT_( destinationFormat,
                                          /* paFloat32: */        PA_USE_CONVERTER_( UInt8, Float32 ),
                                          /* paInt32: */          PA_USE_CONVERTER_( UInt8, Int32 ),
                                          /* paInt24: */          PA_USE_CONVERTER_( UInt8, Int24 ),
                                          /* paInt16: */          PA_USE_CONVERTER_( UInt8, Int16 ),
                                          /* paInt8: */           PA_USE_CONVERTER_( UInt8, Int8 ),
                                          /* paUInt8: */          PA_UNITY_CONVERSION_( 8 )
                                        )
                     )
}